

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

void google::protobuf::compiler::php::GenerateFieldDocComment
               (Printer *printer,FieldDescriptor *field,int is_descriptor,int function_type)

{
  undefined1 is_descriptor_00;
  string sStack_88;
  string local_68;
  string local_48;
  
  is_descriptor_00 = SUB81(&sStack_88,0);
  io::Printer::Print<>(printer,"/**\n");
  GenerateDocCommentBody<google::protobuf::FieldDescriptor>(printer,field);
  FieldDescriptor::DebugString_abi_cxx11_(&local_48,field);
  FirstLineOf(&local_68,&local_48);
  EscapePhpdoc(&sStack_88,&local_68);
  io::Printer::Print<char[4],std::__cxx11::string>
            (printer," * Generated from protobuf field <code>^def^</code>\n",(char (*) [4])0x394bb8,
             &sStack_88);
  std::__cxx11::string::~string((string *)&sStack_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  if (function_type == 2) {
    PhpGetterTypeName_abi_cxx11_
              (&sStack_88,(php *)field,(FieldDescriptor *)(ulong)(is_descriptor != 0),
               (bool)is_descriptor_00);
    io::Printer::Print<char[9],std::__cxx11::string>
              (printer," * @return ^php_type^\n",(char (*) [9])"php_type",&sStack_88);
    std::__cxx11::string::~string((string *)&sStack_88);
  }
  else if (function_type == 1) {
    PhpSetterTypeName_abi_cxx11_
              (&sStack_88,(php *)field,(FieldDescriptor *)(ulong)(is_descriptor != 0),
               (bool)is_descriptor_00);
    io::Printer::Print<char[9],std::__cxx11::string>
              (printer," * @param ^php_type^ $var\n",(char (*) [9])"php_type",&sStack_88);
    std::__cxx11::string::~string((string *)&sStack_88);
    io::Printer::Print<>(printer," * @return $this\n");
  }
  io::Printer::Print<>(printer," */\n");
  return;
}

Assistant:

void GenerateFieldDocComment(io::Printer* printer, const FieldDescriptor* field,
                             int is_descriptor, int function_type) {
  // In theory we should have slightly different comments for setters, getters,
  // etc., but in practice everyone already knows the difference between these
  // so it's redundant information.

  // We start the comment with the main body based on the comments from the
  // .proto file (if present). We then end with the field declaration, e.g.:
  //   optional string foo = 5;
  // If the field is a group, the debug string might end with {.
  printer->Print("/**\n");
  GenerateDocCommentBody(printer, field);
  printer->Print(
    " * Generated from protobuf field <code>^def^</code>\n",
    "def", EscapePhpdoc(FirstLineOf(field->DebugString())));
  if (function_type == kFieldSetter) {
    printer->Print(" * @param ^php_type^ $var\n",
      "php_type", PhpSetterTypeName(field, is_descriptor));
    printer->Print(" * @return $this\n");
  } else if (function_type == kFieldGetter) {
    printer->Print(" * @return ^php_type^\n",
      "php_type", PhpGetterTypeName(field, is_descriptor));
  }
  printer->Print(" */\n");
}